

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Lexer::ParseWhitespaceAndNewlines(Lexer *this)

{
  char *pcVar1;
  byte bVar2;
  size_t sVar3;
  byte *utf8Str;
  
  utf8Str = (byte *)this->m_current;
  bVar2 = *utf8Str;
  if ((bVar2 != 0) && (utf8Str <= this->m_end)) {
    while ((bVar2 < 0x21 && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0))) {
      sVar3 = GetUtf8CharSize((char *)utf8Str);
      pcVar1 = this->m_current;
      utf8Str = (byte *)(pcVar1 + sVar3);
      this->m_current = (char *)utf8Str;
      this->m_columnNumber = this->m_columnNumber + 1;
      bVar2 = pcVar1[sVar3];
      if ((bVar2 == 0) || (this->m_end < utf8Str)) break;
    }
  }
  this->m_columnMarker = this->m_columnNumber;
  return;
}

Assistant:

inline_t void Lexer::ParseWhitespaceAndNewlines()
	{
		while (!IsEndOfText())
		{
			if (!IsWhitespace(*m_current) && !IsNewline(*m_current))
				break;
			AdvanceCurrent();
		}
		m_columnMarker = m_columnNumber;
	}